

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret.cpp
# Opt level: O2

void __thiscall
duckdb::KeyValueSecretReader::ThrowNotFoundError
          (KeyValueSecretReader *this,string *secret_key,string *setting_name)

{
  KeyValueSecret *pKVar1;
  InvalidConfigurationException *pIVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_168;
  string secret_scope;
  string secret_scope_hint_message;
  string base_message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  ::std::__cxx11::string::string
            ((string *)&base_message,
             "Failed to fetch a parameter from either the secret key \'%s\' or the setting \'%s\'",
             (allocator *)&secret_scope);
  if ((this->secret).ptr == (KeyValueSecret *)0x0) {
    ::std::__cxx11::string::string((string *)&secret_scope,(string *)&this->path);
    if (secret_scope._M_string_length == 0) {
      ::std::__cxx11::string::string
                ((string *)&secret_scope_hint_message,".",(allocator *)&bStack_168);
    }
    else {
      ::std::operator+(&bStack_168," for \'",&secret_scope);
      ::std::operator+(&secret_scope_hint_message,&bStack_168,"\'.");
      ::std::__cxx11::string::~string((string *)&bStack_168);
    }
    pIVar2 = (InvalidConfigurationException *)__cxa_allocate_exception(0x10);
    ::std::operator+(&bStack_168,&base_message,": no secret was found%s");
    ::std::__cxx11::string::string((string *)&local_48,(string *)secret_key);
    ::std::__cxx11::string::string((string *)&local_68,(string *)setting_name);
    ::std::__cxx11::string::string((string *)&local_88,(string *)&secret_scope_hint_message);
    InvalidConfigurationException::
    InvalidConfigurationException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (pIVar2,&bStack_168,&local_48,&local_68,&local_88);
    __cxa_throw(pIVar2,&InvalidConfigurationException::typeinfo,::std::runtime_error::~runtime_error
               );
  }
  pIVar2 = (InvalidConfigurationException *)__cxa_allocate_exception(0x10);
  ::std::operator+(&secret_scope,&base_message,
                   ": secret \'%s\' did not contain the key, also the setting was not found.");
  ::std::__cxx11::string::string((string *)&local_a8,(string *)secret_key);
  ::std::__cxx11::string::string((string *)&local_c8,(string *)setting_name);
  pKVar1 = optional_ptr<const_duckdb::KeyValueSecret,_true>::operator->(&this->secret);
  ::std::__cxx11::string::string((string *)&local_e8,(string *)&(pKVar1->super_BaseSecret).name);
  InvalidConfigurationException::
  InvalidConfigurationException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (pIVar2,&secret_scope,&local_a8,&local_c8,&local_e8);
  __cxa_throw(pIVar2,&InvalidConfigurationException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void KeyValueSecretReader::ThrowNotFoundError(const string &secret_key, const string &setting_name) {
	string base_message = "Failed to fetch a parameter from either the secret key '%s' or the setting '%s'";

	if (!secret) {
		string secret_scope = path;
		string secret_scope_hint_message = secret_scope.empty() ? "." : " for '" + secret_scope + "'.";
		throw InvalidConfigurationException(base_message + ": no secret was found%s", secret_key, setting_name,
		                                    secret_scope_hint_message);
	}

	throw InvalidConfigurationException(base_message +
	                                        ": secret '%s' did not contain the key, also the setting was not found.",
	                                    secret_key, setting_name, secret->GetName());
}